

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall ninx::lexer::Lexer::Lexer(Lexer *this,istream *stream)

{
  allocator local_39;
  string local_38;
  istream *local_18;
  istream *stream_local;
  Lexer *this_local;
  
  local_18 = stream;
  stream_local = (istream *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"unknown_origin",&local_39);
  Lexer(this,stream,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

ninx::lexer::Lexer::Lexer(std::istream &stream) : Lexer(stream, "unknown_origin") {}